

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O1

bool benchmarkMany(uint32_t n,uint32_t m,uint32_t iterations,pospopcnt_u16_method_type fn,
                  bool verbose,bool test)

{
  uint uVar1;
  uint16_t *puVar2;
  undefined1 auVar3 [16];
  pospopcnt_u16_method_type p_Var4;
  uint uVar5;
  result_type rVar6;
  long lVar7;
  bool bVar8;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar20 [16];
  undefined1 in_ZMM3 [64];
  vector<int,_std::allocator<int>_> evts;
  vector<double,_std::allocator<double>_> avg;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> mins;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  vdata;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  allresults;
  uniform_int_distribution<int> dis;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> results;
  LinuxEvents<0> unified;
  random_device rd;
  mt19937 gen;
  vector<int,_std::allocator<int>_> local_2948;
  uint local_2924;
  uint32_t local_2920;
  allocator_type local_2919;
  undefined1 local_2918 [16];
  pointer local_2908;
  ulong local_2900;
  uint32_t local_28f8;
  undefined4 local_28f4;
  uint32_t local_28f0;
  uint local_28ec;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_28e8;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_28d0;
  value_type local_28b8;
  long local_28a0;
  undefined1 local_2898 [16];
  pointer local_2888;
  pospopcnt_u16_method_type local_2878;
  param_type local_2870;
  undefined1 local_2868 [16];
  pointer local_2858;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2848;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2830;
  vector<int,_std::allocator<int>_> local_2818;
  LinuxEvents<0> local_2800;
  anon_union_5000_2_650ea050_for_random_device_0 local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  bool bVar9;
  
  local_2924 = (uint)CONCAT71(in_register_00000089,test);
  local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_28f8 = iterations;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_2740.field_0,(ulong)n
             ,(allocator_type *)&local_13b8);
  local_2900 = (ulong)m;
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector(&local_28d0,(ulong)m,(value_type *)&local_2740.field_0,(allocator_type *)&local_2800);
  if ((void *)CONCAT44(local_2740._M_mt._M_x[0]._4_4_,local_2740._M_mt._M_x[0]._0_4_) != (void *)0x0
     ) {
    operator_delete((void *)CONCAT44(local_2740._M_mt._M_x[0]._4_4_,local_2740._M_mt._M_x[0]._0_4_))
    ;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 0;
  if (local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2948,
               (iterator)
               local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 1;
  if (local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2948,
               (iterator)
               local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 5;
  if (local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2948,
               (iterator)
               local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 5;
    local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 2;
  if (local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2948,
               (iterator)
               local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 3;
  if (local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2948,
               (iterator)
               local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 3;
    local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 9;
  if (local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2948,
               (iterator)
               local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 9;
    local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_2818,&local_2948);
  LinuxEvents<0>::LinuxEvents(&local_2800,&local_2818);
  if (local_2818.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2818.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_2868 = (undefined1  [16])0x0;
  local_2858 = (pointer)0x0;
  local_2888 = (pointer)0x0;
  local_2898 = (undefined1  [16])0x0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::resize
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_2868,
             (long)local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  std::random_device::random_device((random_device *)&local_2740.field_0);
  uVar5 = std::random_device::_M_getval();
  auVar19 = in_ZMM2._0_16_;
  auVar20 = in_ZMM3._0_16_;
  local_13b8._M_x[0] = (unsigned_long)uVar5;
  lVar7 = 1;
  uVar10 = local_13b8._M_x[0];
  do {
    uVar10 = (ulong)(((uint)(uVar10 >> 0x1e) ^ (uint)uVar10) * 0x6c078965 + (int)lVar7);
    local_13b8._M_x[lVar7] = uVar10;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x270);
  local_13b8._M_p = 0x270;
  local_2870._M_a = 0;
  local_2870._M_b = 0xffff;
  bVar13 = local_28f8 != 0;
  if (local_28f8 == 0) {
    bVar8 = true;
  }
  else {
    local_28f4 = (undefined4)CONCAT71(in_register_00000081,verbose);
    bVar14 = m != 0;
    local_28a0 = local_2900 * 0x18;
    bVar9 = true;
    bVar8 = true;
    local_2924 = local_2924 ^ 1;
    uVar5 = 0;
    local_2920 = m;
    local_28f0 = n;
    local_2878 = fn;
    do {
      auVar20 = in_ZMM3._0_16_;
      auVar19 = in_ZMM2._0_16_;
      local_28ec = uVar5;
      if (local_28d0.
          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_28d0.
          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar10 = 0;
        do {
          if (local_28d0.
              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar10].
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_28d0.
              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar10].
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar11 = 0;
            do {
              rVar6 = std::uniform_int_distribution<int>::operator()
                                ((uniform_int_distribution<int> *)&local_2870,&local_13b8,
                                 &local_2870);
              local_28d0.
              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar10].
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start[uVar11] = (unsigned_short)rVar6;
              uVar11 = uVar11 + 1;
            } while (uVar11 < (ulong)((long)local_28d0.
                                            super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_28d0.
                                            super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 1));
          }
          auVar20 = in_ZMM3._0_16_;
          auVar19 = in_ZMM2._0_16_;
          uVar10 = uVar10 + 1;
        } while (uVar10 < (ulong)(((long)local_28d0.
                                         super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_28d0.
                                         super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      local_2918 = (undefined1  [16])0x0;
      local_2908 = (pointer)0x0;
      local_2918._0_8_ = operator_new(0x40);
      local_2908 = (pointer)(local_2918._0_8_ + 0x40);
      auVar18 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
      *(undefined1 (*) [64])local_2918._0_8_ = auVar18;
      local_2918._8_8_ = local_2908;
      auVar18 = ZEXT1664(auVar19);
      auVar17 = ZEXT1664(auVar20);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector(&local_28e8,local_2900,(value_type *)local_2918,(allocator_type *)&local_28b8);
      p_Var4 = local_2878;
      m = local_2920;
      if ((pointer)local_2918._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_2918._0_8_);
      }
      auVar20 = auVar17._0_16_;
      auVar19 = auVar18._0_16_;
      if (m != 0) {
        lVar7 = 0;
        do {
          puVar2 = *(uint16_t **)
                    ((long)&((local_28d0.
                              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar7);
          pospopcnt_u16_scalar_naive
                    (puVar2,(uint32_t)
                            ((ulong)(*(long *)((long)&((local_28d0.
                                                                                                                
                                                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish +
                                              lVar7) - (long)puVar2) >> 1),
                     *(uint32_t **)
                      ((long)&((local_28e8.
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar7));
          auVar20 = auVar17._0_16_;
          auVar19 = auVar18._0_16_;
          lVar7 = lVar7 + 0x18;
        } while (local_28a0 != lVar7);
      }
      local_28b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_28b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_28b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_28b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(0x40);
      local_28b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)local_28b8.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + 0x40);
      auVar18 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
      *(undefined1 (*) [64])
       local_28b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = auVar18;
      local_28b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_28b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      auVar18 = ZEXT1664(auVar19);
      auVar17 = ZEXT1664(auVar20);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)local_2918,local_2900,&local_28b8,&local_2919);
      if (local_28b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_28b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      LinuxEvents<0>::start(&local_2800);
      auVar20 = auVar17._0_16_;
      auVar19 = auVar18._0_16_;
      if (m != 0) {
        lVar7 = 0;
        do {
          puVar2 = *(uint16_t **)
                    ((long)&((local_28d0.
                              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar7);
          (*p_Var4)(puVar2,(uint32_t)
                           ((ulong)(*(long *)((long)&((local_28d0.
                                                                                                              
                                                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish +
                                             lVar7) - (long)puVar2) >> 1),
                    *(uint32_t **)
                     ((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                              local_2918._0_8_)->_M_impl).super__Vector_impl_data._M_start + lVar7))
          ;
          auVar20 = auVar17._0_16_;
          auVar19 = auVar18._0_16_;
          lVar7 = lVar7 + 0x18;
        } while (local_28a0 != lVar7);
      }
      LinuxEvents<0>::end(&local_2800,
                          (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                          local_2868);
      if (m == 0) {
LAB_001118a5:
        bVar12 = false;
      }
      else {
        uVar10 = 0;
        uVar11 = 0;
        do {
          auVar18 = ZEXT864(uVar11);
          lVar7 = 0;
          do {
            auVar17 = vpmovzxdq_avx512f(*(undefined1 (*) [32])
                                         ((((pointer)(local_2918._0_8_ + uVar10 * 0x18))->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data._M_start + lVar7));
            auVar18 = vpaddq_avx512f(auVar18,auVar17);
            lVar7 = lVar7 + 8;
          } while (lVar7 != 0x10);
          auVar16 = vextracti64x4_avx512f(auVar18,1);
          auVar18 = vpaddq_avx512f(auVar18,ZEXT3264(auVar16));
          auVar15 = vpaddq_avx(auVar18._0_16_,auVar18._16_16_);
          auVar3 = vpshufd_avx(auVar15,0xee);
          auVar15 = vpaddq_avx(auVar15,auVar3);
          uVar11 = auVar15._0_8_;
          uVar10 = uVar10 + 1;
        } while (uVar10 != local_2900);
        if (uVar11 == 0) goto LAB_001118a5;
        bVar12 = bVar14;
        if (m != 0) {
          uVar10 = 0;
          do {
            lVar7 = 0;
            do {
              uVar5 = local_28e8.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar10].
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar7];
              uVar1 = (((pointer)(local_2918._0_8_ + uVar10 * 0x18))->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar7];
              if (uVar5 != uVar1 && (char)local_2924 == '\0') {
                puts("bug:");
                printf("expected : ");
                print16(local_28e8.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar10].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
                printf("got      : ");
                print16((((pointer)(local_2918._0_8_ + uVar10 * 0x18))->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start);
                m = local_2920;
                goto LAB_0011189f;
              }
              bVar8 = bVar9;
              if (uVar5 != uVar1) {
                bVar8 = false;
              }
              lVar7 = lVar7 + 1;
              bVar9 = bVar8;
            } while (lVar7 != 0x10);
            uVar10 = uVar10 + 1;
            bVar12 = uVar10 < local_2900;
            m = local_2920;
          } while (uVar10 != local_2900);
        }
LAB_0011189f:
        if (bVar12) goto LAB_001118a5;
        bVar12 = true;
        std::
        vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
        ::push_back((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                     *)local_2898,(value_type *)local_2868);
      }
      in_ZMM2 = ZEXT1664(auVar19);
      in_ZMM3 = ZEXT1664(auVar20);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)local_2918);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_28e8);
      auVar19 = in_ZMM2._0_16_;
      auVar20 = in_ZMM3._0_16_;
      if (!bVar12) break;
      uVar5 = local_28ec + 1;
      bVar13 = uVar5 < local_28f8;
    } while (uVar5 != local_28f8);
    verbose = SUB41(local_28f4,0);
    n = local_28f0;
  }
  if (bVar13) {
    bVar8 = false;
  }
  else {
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::vector(&local_2830,
             (vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
              *)local_2898);
    compute_mins((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)&local_28e8,
                 &local_2830);
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::~vector(&local_2830);
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::vector(&local_2848,
             (vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
              *)local_2898);
    compute_averages((vector<double,_std::allocator<double>_> *)local_2918,&local_2848);
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::~vector(&local_2848);
    if (verbose == false) {
      auVar15 = vcvtusi2sd_avx512f(auVar19,((local_28e8.
                                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_start);
      auVar20 = vcvtusi2sd_avx512f(auVar19,m * n);
      auVar19 = vcvtusi2sd_avx512f(auVar19,local_28e8.
                                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1].
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      printf("cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n",
             auVar15._0_8_ / auVar20._0_8_,auVar19._0_8_ / auVar20._0_8_);
    }
    else {
      auVar19._0_8_ =
           ((local_28e8.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
      auVar19._8_8_ =
           ((local_28e8.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      auVar15 = vcvtuqq2pd_avx512vl(auVar19);
      auVar19 = vshufpd_avx(auVar15,auVar15,1);
      auVar20 = vcvtusi2sd_avx512f(auVar20,m * n);
      printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, instructions per 16-bit word %4.3f \n"
             ,auVar19._0_8_ / auVar15._0_8_,auVar15._0_8_ / auVar20._0_8_,
             auVar19._0_8_ / auVar20._0_8_);
      printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu cache ref., %8llu cache mis.\n"
             ,((local_28e8.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start,
             ((local_28e8.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             ((local_28e8.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             local_28e8.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_28e8.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish);
      printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f cache ref., %8.1f cache mis.\n"
             ,(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_2918._0_8_)->
              _M_impl).super__Vector_impl_data._M_start,
             (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_2918._0_8_)->
             _M_impl).super__Vector_impl_data._M_finish,
             (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_2918._0_8_)->
             _M_impl).super__Vector_impl_data._M_end_of_storage,
             (((pointer)(local_2918._0_8_ + 0x18))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (((pointer)(local_2918._0_8_ + 0x18))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish);
    }
    if ((pointer)local_2918._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_2918._0_8_);
    }
    if (local_28e8.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28e8.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::random_device::_M_fini();
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             *)local_2898);
  if ((pointer)local_2868._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2868._0_8_);
  }
  LinuxEvents<0>::~LinuxEvents(&local_2800);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_28d0);
  if (local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2948.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar8;
}

Assistant:

bool benchmarkMany(uint32_t n, uint32_t m, uint32_t iterations, pospopcnt_u16_method_type fn, bool verbose, bool test) {
    std::vector<int> evts;
    std::vector<std::vector<uint16_t>> vdata(m, std::vector<uint16_t>(n));
    evts.push_back(PERF_COUNT_HW_CPU_CYCLES);
    evts.push_back(PERF_COUNT_HW_INSTRUCTIONS);
    evts.push_back(PERF_COUNT_HW_BRANCH_MISSES);
    evts.push_back(PERF_COUNT_HW_CACHE_REFERENCES);
    evts.push_back(PERF_COUNT_HW_CACHE_MISSES);
    evts.push_back(PERF_COUNT_HW_REF_CPU_CYCLES);
    LinuxEvents<PERF_TYPE_HARDWARE> unified(evts);
    std::vector<unsigned long long> results; // tmp buffer
    std::vector< std::vector<unsigned long long> > allresults;
    results.resize(evts.size());
    
    std::random_device rd;
    std::mt19937 gen(rd());
    std::uniform_int_distribution<> dis(0, 0xFFFF);

    bool isok = true;
    for (uint32_t i = 0; i < iterations; i++) {
        for (size_t k = 0; k < vdata.size(); k++) {
            for(size_t k2 = 0; k2 < vdata[k].size() ; k2++) { 
               vdata[k][k2] = dis(gen); // random init.
            }
        }
        std::vector<std::vector<uint32_t>> correctflags(m,std::vector<uint32_t>(16));
        for (size_t k = 0; k < m; k++) {
          pospopcnt_u16_scalar_naive(vdata[k].data(), vdata[k].size(), correctflags[k].data()); // this is our gold standard
        }
        std::vector<std::vector<uint32_t>> flags(m,std::vector<uint32_t>(16));
        
        unified.start();
        for (size_t k = 0; k < m ; k++) {
          fn(vdata[k].data(), vdata[k].size(), flags[k].data());
        }
        unified.end(results);

        uint64_t tot_obs = 0;
        for (size_t km = 0; km < m; ++km)
          for (size_t k = 0; k < 16; ++k) tot_obs += flags[km][k];
        if (tot_obs == 0) { // when a method is not supported it returns all zero
            return false;
        }
        for (size_t km = 0; km < m; ++km) {
          for (size_t k = 0; k < 16; k++) {
            if (correctflags[km][k] != flags[km][k]) {
                if (test) {
                    printf("bug:\n");
                    printf("expected : ");
                    print16(correctflags[km].data());
                    printf("got      : ");
                    print16(flags[km].data());
                    return false;
                } else {
                    isok = false;
                }
            }
          }
        }
        allresults.push_back(results);
    }

    std::vector<unsigned long long> mins = compute_mins(allresults);
    std::vector<double> avg = compute_averages(allresults);
    
    if (verbose) {
        printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, "
               "instructions per 16-bit word %4.3f \n",
                double(mins[1]) / mins[0], double(mins[0]) / (n*m), double(mins[1]) / (n*m));
        // first we display mins
        printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu "
               "cache ref., %8llu cache mis.\n",
                mins[0], mins[1], mins[2], mins[3], mins[4]);
        printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f "
               "cache ref., %8.1f cache mis.\n",
                avg[0], avg[1], avg[2], avg[3], avg[4]);
    } else {
        printf("cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n", double(mins[0]) / (n*m), double(mins[5]) / (n*m));
    }

    return isok;
}